

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> __thiscall
kj::anon_unknown_35::InMemoryDirectory::Impl::openEntry(Impl *this,StringPtr name,WriteMode mode)

{
  iterator iVar1;
  undefined4 in_register_0000000c;
  _Base_ptr *pp_Var2;
  EntryImpl *pEVar3;
  __enable_if_t<is_constructible<value_type,_pair<StringPtr,_EntryImpl>_>::value,_pair<iterator,_bool>_>
  _Var4;
  StringPtr value;
  EntryImpl entry;
  Array<char> local_c8;
  EntryImpl local_b0;
  pair<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl> local_70;
  
  value.content.size_._4_4_ = in_register_0000000c;
  value.content.size_._0_4_ = mode;
  value.content.ptr = (char *)name.content.size_;
  heapString((String *)&local_c8,(kj *)name.content.ptr,value);
  if ((mode & CREATE) == 0) {
    if ((mode & MODIFY) == 0) {
      pEVar3 = (EntryImpl *)0x0;
    }
    else {
      local_70.first.content.ptr = local_c8.ptr;
      if (local_c8.size_ == 0) {
        local_70.first.content.ptr = "";
      }
      local_70.first.content.size_ = local_c8.size_ + (local_c8.size_ == 0);
      iVar1 = std::
              map<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>_>_>
              ::find(&this->entries,&local_70.first);
      pEVar3 = (EntryImpl *)0x0;
      if ((_Rb_tree_header *)iVar1._M_node != &(this->entries)._M_t._M_impl.super__Rb_tree_header) {
        pEVar3 = (EntryImpl *)&iVar1._M_node[1]._M_left;
      }
    }
  }
  else {
    local_b0.name.content.ptr = local_c8.ptr;
    local_b0.name.content.size_ = local_c8.size_;
    local_b0.name.content.disposer = local_c8.disposer;
    local_b0.node.tag = 0;
    local_70.first.content.ptr = "";
    if (local_c8.size_ != 0) {
      local_70.first.content.ptr = local_c8.ptr;
    }
    local_70.first.content.size_ = local_c8.size_ + (local_c8.size_ == 0);
    local_c8.ptr = (char *)0x0;
    local_c8.size_ = 0;
    EntryImpl::EntryImpl(&local_70.second,&local_b0);
    _Var4 = std::
            map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
            ::
            insert<std::pair<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>
                      ((map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
                        *)&this->entries,&local_70);
    EntryImpl::~EntryImpl(&local_70.second);
    pp_Var2 = &_Var4.first._M_node._M_node[1]._M_left;
    pEVar3 = (EntryImpl *)0x0;
    if (((undefined1  [16])_Var4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar3 = (EntryImpl *)pp_Var2;
    }
    if ((mode & MODIFY) != 0) {
      pEVar3 = (EntryImpl *)pp_Var2;
    }
    EntryImpl::~EntryImpl(&local_b0);
  }
  Array<char>::~Array(&local_c8);
  return (Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&>)pEVar3;
}

Assistant:

Maybe<EntryImpl&> openEntry(kj::StringPtr name, WriteMode mode) {
      // TODO(perf): We could avoid a copy if the entry exists, at the expense of a double-lookup
      //   if it doesn't. Maybe a better map implementation will solve everything?
      return openEntry(heapString(name), mode);
    }